

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void google::protobuf::compiler::anon_unknown_0::SortMessages
               (FileDescriptorProto *file_descriptor_proto)

{
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *descriptor_proto;
  Rep *pRVar2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this;
  int index;
  DescriptorProto **__i;
  void **ppvVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = *(int *)((long)&file_descriptor_proto->field_0 + 0x28);
  uVar4 = (ulong)iVar1;
  if (0 < (long)uVar4) {
    index = 0;
    do {
      descriptor_proto =
           protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(file_descriptor_proto->field_0)._impl_.message_type_.
                       super_RepeatedPtrFieldBase,index);
      SortMessages(descriptor_proto);
      index = index + 1;
    } while (iVar1 != index);
  }
  this = &(file_descriptor_proto->field_0)._impl_.message_type_;
  if ((*(byte *)((long)&file_descriptor_proto->field_0 + 0x20) & 1) != 0) {
    pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
    this = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar2->elements;
  }
  if (iVar1 != 0) {
    ppvVar3 = &(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + uVar4;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::DescriptorProto**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::(anonymous_namespace)::CompareDescriptorNames>>
              (this,ppvVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (iVar1 < 0x11) {
      std::
      __insertion_sort<google::protobuf::DescriptorProto**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::(anonymous_namespace)::CompareDescriptorNames>>
                (this,ppvVar3);
      return;
    }
    ppvVar3 = (void **)((long)(this + 5) + 8);
    std::
    __insertion_sort<google::protobuf::DescriptorProto**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::(anonymous_namespace)::CompareDescriptorNames>>
              (this,ppvVar3);
    lVar5 = uVar4 * 8 + -0x80;
    do {
      std::
      __unguarded_linear_insert<google::protobuf::DescriptorProto**,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::(anonymous_namespace)::CompareDescriptorNames>>
                (ppvVar3);
      ppvVar3 = ppvVar3 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void SortMessages(FileDescriptorProto* file_descriptor_proto) {
  int size = file_descriptor_proto->message_type_size();
  // recursively sort; we can't guarantee the order of nested messages either
  for (int i = 0; i < size; ++i) {
    SortMessages(file_descriptor_proto->mutable_message_type(i));
  }
  DescriptorProto** data =
      file_descriptor_proto->mutable_message_type()->mutable_data();
  std::sort(data, data + size, CompareDescriptorNames());
}